

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

void __thiscall CGraphics_Threaded::LinesDraw(CGraphics_Threaded *this,CLineItem *pArray,int Num)

{
  float fVar1;
  int in_EDX;
  int iVar2;
  long in_RSI;
  CGraphics_Threaded *in_RDI;
  int i;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int local_18;
  
  dbg_assert_imp((char *)in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,(char *)0x12e797
                );
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    in_RDI->m_aVertices[in_RDI->m_NumVertices + local_18 * 2].m_Pos.x =
         *(float *)(in_RSI + (long)local_18 * 0x10);
    in_RDI->m_aVertices[in_RDI->m_NumVertices + local_18 * 2].m_Pos.y =
         *(float *)(in_RSI + (long)local_18 * 0x10 + 4);
    iVar2 = in_RDI->m_NumVertices + local_18 * 2;
    fVar1 = in_RDI->m_aTexture[0].v;
    in_RDI->m_aVertices[iVar2].m_Tex.u = in_RDI->m_aTexture[0].u;
    in_RDI->m_aVertices[iVar2].m_Tex.v = fVar1;
    in_RDI->m_aVertices[iVar2].m_Tex.i = in_RDI->m_aTexture[0].i;
    iVar2 = in_RDI->m_NumVertices + local_18 * 2;
    fVar1 = in_RDI->m_aColor[0].g;
    in_RDI->m_aVertices[iVar2].m_Color.r = in_RDI->m_aColor[0].r;
    in_RDI->m_aVertices[iVar2].m_Color.g = fVar1;
    fVar1 = in_RDI->m_aColor[0].a;
    in_RDI->m_aVertices[iVar2].m_Color.b = in_RDI->m_aColor[0].b;
    in_RDI->m_aVertices[iVar2].m_Color.a = fVar1;
    in_RDI->m_aVertices[in_RDI->m_NumVertices + local_18 * 2 + 1].m_Pos.x =
         *(float *)(in_RSI + (long)local_18 * 0x10 + 8);
    in_RDI->m_aVertices[in_RDI->m_NumVertices + local_18 * 2 + 1].m_Pos.y =
         *(float *)(in_RSI + (long)local_18 * 0x10 + 0xc);
    iVar2 = in_RDI->m_NumVertices + local_18 * 2 + 1;
    fVar1 = in_RDI->m_aTexture[1].v;
    in_RDI->m_aVertices[iVar2].m_Tex.u = in_RDI->m_aTexture[1].u;
    in_RDI->m_aVertices[iVar2].m_Tex.v = fVar1;
    in_RDI->m_aVertices[iVar2].m_Tex.i = in_RDI->m_aTexture[1].i;
    iVar2 = in_RDI->m_NumVertices + local_18 * 2 + 1;
    fVar1 = in_RDI->m_aColor[1].g;
    in_RDI->m_aVertices[iVar2].m_Color.r = in_RDI->m_aColor[1].r;
    in_RDI->m_aVertices[iVar2].m_Color.g = fVar1;
    fVar1 = in_RDI->m_aColor[1].a;
    in_RDI->m_aVertices[iVar2].m_Color.b = in_RDI->m_aColor[1].b;
    in_RDI->m_aVertices[iVar2].m_Color.a = fVar1;
  }
  AddVertices(in_RDI,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

void CGraphics_Threaded::LinesDraw(const CLineItem *pArray, int Num)
{
	dbg_assert(m_Drawing == DRAWING_LINES, "called Graphics()->LinesDraw without begin");

	for(int i = 0; i < Num; ++i)
	{
		m_aVertices[m_NumVertices + 2*i].m_Pos.x = pArray[i].m_X0;
		m_aVertices[m_NumVertices + 2*i].m_Pos.y = pArray[i].m_Y0;
		m_aVertices[m_NumVertices + 2*i].m_Tex = m_aTexture[0];
		m_aVertices[m_NumVertices + 2*i].m_Color = m_aColor[0];

		m_aVertices[m_NumVertices + 2*i + 1].m_Pos.x = pArray[i].m_X1;
		m_aVertices[m_NumVertices + 2*i + 1].m_Pos.y = pArray[i].m_Y1;
		m_aVertices[m_NumVertices + 2*i + 1].m_Tex = m_aTexture[1];
		m_aVertices[m_NumVertices + 2*i + 1].m_Color = m_aColor[1];
	}

	AddVertices(2*Num);
}